

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall
tchecker::clockbounds::local_lu_map_t::resize
          (local_lu_map_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  map_t *pmVar1;
  reference ppmVar2;
  uint local_2c;
  value_type pmStack_28;
  loc_id_t id;
  value_type local_20;
  clock_id_t local_18;
  loc_id_t local_14;
  clock_id_t clock_nb_local;
  loc_id_t loc_nb_local;
  local_lu_map_t *this_local;
  
  local_18 = clock_nb;
  local_14 = loc_nb;
  _clock_nb_local = this;
  clear(this);
  this->_loc_nb = local_14;
  this->_clock_nb = local_18;
  local_20 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::resize(&this->_L,(ulong)this->_loc_nb,&local_20);
  pmStack_28 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::resize(&this->_U,(ulong)this->_loc_nb,&stack0xffffffffffffffd8);
  for (local_2c = 0; local_2c < this->_loc_nb; local_2c = local_2c + 1) {
    pmVar1 = allocate_map((ulong)this->_clock_nb);
    ppmVar2 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_L,(ulong)local_2c);
    *ppmVar2 = pmVar1;
    pmVar1 = allocate_map((ulong)this->_clock_nb);
    ppmVar2 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_U,(ulong)local_2c);
    *ppmVar2 = pmVar1;
    ppmVar2 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_L,(ulong)local_2c);
    clockbounds::clear(*ppmVar2);
    ppmVar2 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_U,(ulong)local_2c);
    clockbounds::clear(*ppmVar2);
  }
  return;
}

Assistant:

void local_lu_map_t::resize(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
{
  clear();

  _loc_nb = loc_nb;
  _clock_nb = clock_nb;
  _L.resize(_loc_nb, nullptr);
  _U.resize(_loc_nb, nullptr);
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id) {
    _L[id] = tchecker::clockbounds::allocate_map(_clock_nb);
    _U[id] = tchecker::clockbounds::allocate_map(_clock_nb);
    tchecker::clockbounds::clear(*_L[id]);
    tchecker::clockbounds::clear(*_U[id]);
  }
}